

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O3

void __thiscall
Adjacency_Subgraph_is_local_Test::~Adjacency_Subgraph_is_local_Test
          (Adjacency_Subgraph_is_local_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, is_local) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test is_local on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_TRUE(subgraph.is_local(0));
  EXPECT_TRUE(subgraph.is_local(1));
  EXPECT_TRUE(subgraph.is_local(2));
  EXPECT_TRUE(subgraph.is_local(3));
  EXPECT_TRUE(subgraph.is_local(4));

  // Test is_local on both level and primary parts of the subgraph.
  subgraph = Adjacency_Subgraph(graph, {4}, 1);
  EXPECT_TRUE(subgraph.is_local(0));
  EXPECT_FALSE(subgraph.is_local(1));
  EXPECT_FALSE(subgraph.is_local(2));
  EXPECT_FALSE(subgraph.is_local(3));
  EXPECT_FALSE(subgraph.is_local(4));

  EXPECT_DEATH(subgraph.is_local(10) == false, "./*");
}